

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::cbtCollisionWorld
          (cbtCollisionWorld *this,cbtDispatcher *dispatcher,cbtBroadphaseInterface *pairCache,
          cbtCollisionConfiguration *collisionConfiguration)

{
  this->_vptr_cbtCollisionWorld = (_func_int **)&PTR__cbtCollisionWorld_01193ca8;
  (this->m_collisionObjects).m_ownsMemory = true;
  (this->m_collisionObjects).m_data = (cbtCollisionObject **)0x0;
  (this->m_collisionObjects).m_size = 0;
  (this->m_collisionObjects).m_capacity = 0;
  this->m_dispatcher1 = dispatcher;
  cbtDispatcherInfo::cbtDispatcherInfo(&this->m_dispatchInfo);
  this->m_broadphasePairCache = pairCache;
  this->m_debugDrawer = (cbtIDebugDraw *)0x0;
  this->m_forceUpdateAllAabbs = true;
  (this->timer_collision_broad).m_start.__d.__r = 0;
  (this->timer_collision_broad).m_end.__d.__r = 0;
  (this->timer_collision_narrow).m_start.__d.__r = 0;
  (this->timer_collision_narrow).m_end.__d.__r = 0;
  return;
}

Assistant:

cbtCollisionWorld::cbtCollisionWorld(cbtDispatcher* dispatcher, cbtBroadphaseInterface* pairCache, cbtCollisionConfiguration* collisionConfiguration)
	: m_dispatcher1(dispatcher),
	  m_broadphasePairCache(pairCache),
	  m_debugDrawer(0),
	  m_forceUpdateAllAabbs(true)
{
}